

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

uint8_t * assembler::anon_unknown_0::get_address_8bit
                    (operand oper,uint64_t operand_mem,registers *regs)

{
  registers *regs_local;
  uint64_t operand_mem_local;
  registers *prStack_10;
  operand oper_local;
  
  switch(oper) {
  case EMPTY:
    prStack_10 = (registers *)0x0;
    break;
  case AL:
    prStack_10 = regs;
    break;
  case AH:
    prStack_10 = (registers *)((long)&regs->rax + 1);
    break;
  case BL:
    prStack_10 = (registers *)&regs->rbx;
    break;
  case BH:
    prStack_10 = (registers *)((long)&regs->rbx + 1);
    break;
  case CL:
    prStack_10 = (registers *)&regs->rcx;
    break;
  case CH:
    prStack_10 = (registers *)((long)&regs->rcx + 1);
    break;
  case DL:
    prStack_10 = (registers *)&regs->rdx;
    break;
  case DH:
    prStack_10 = (registers *)((long)&regs->rdx + 1);
    break;
  case RAX:
    prStack_10 = (registers *)0x0;
    break;
  case RBX:
    prStack_10 = (registers *)0x0;
    break;
  case RCX:
    prStack_10 = (registers *)0x0;
    break;
  case RDX:
    prStack_10 = (registers *)0x0;
    break;
  case RSI:
    prStack_10 = (registers *)0x0;
    break;
  case RDI:
    prStack_10 = (registers *)0x0;
    break;
  case RSP:
    prStack_10 = (registers *)0x0;
    break;
  case RBP:
    prStack_10 = (registers *)0x0;
    break;
  case R8:
    prStack_10 = (registers *)0x0;
    break;
  case R9:
    prStack_10 = (registers *)0x0;
    break;
  case R10:
    prStack_10 = (registers *)0x0;
    break;
  case R11:
    prStack_10 = (registers *)0x0;
    break;
  case R12:
    prStack_10 = (registers *)0x0;
    break;
  case R13:
    prStack_10 = (registers *)0x0;
    break;
  case R14:
    prStack_10 = (registers *)0x0;
    break;
  case R15:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RAX:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RBX:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RCX:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RDX:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RDI:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RSI:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RSP:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_RBP:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R8:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R9:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R10:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R11:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R12:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R13:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R14:
    prStack_10 = (registers *)0x0;
    break;
  case MEM_R15:
    prStack_10 = (registers *)0x0;
    break;
  case BYTE_MEM_RAX:
    prStack_10 = (registers *)(regs->rax + operand_mem);
    break;
  case BYTE_MEM_RBX:
    prStack_10 = (registers *)(regs->rbx + operand_mem);
    break;
  case BYTE_MEM_RCX:
    prStack_10 = (registers *)(regs->rcx + operand_mem);
    break;
  case BYTE_MEM_RDX:
    prStack_10 = (registers *)(regs->rdx + operand_mem);
    break;
  case BYTE_MEM_RDI:
    prStack_10 = (registers *)(regs->rdi + operand_mem);
    break;
  case BYTE_MEM_RSI:
    prStack_10 = (registers *)(regs->rsi + operand_mem);
    break;
  case BYTE_MEM_RSP:
    prStack_10 = (registers *)(regs->rsp + operand_mem);
    break;
  case BYTE_MEM_RBP:
    prStack_10 = (registers *)(regs->rbp + operand_mem);
    break;
  case BYTE_MEM_R8:
    prStack_10 = (registers *)(regs->r8 + operand_mem);
    break;
  case BYTE_MEM_R9:
    prStack_10 = (registers *)(regs->r9 + operand_mem);
    break;
  case BYTE_MEM_R10:
    prStack_10 = (registers *)(regs->r10 + operand_mem);
    break;
  case BYTE_MEM_R11:
    prStack_10 = (registers *)(regs->r11 + operand_mem);
    break;
  case BYTE_MEM_R12:
    prStack_10 = (registers *)(regs->r12 + operand_mem);
    break;
  case BYTE_MEM_R13:
    prStack_10 = (registers *)(regs->r13 + operand_mem);
    break;
  case BYTE_MEM_R14:
    prStack_10 = (registers *)(regs->r14 + operand_mem);
    break;
  case BYTE_MEM_R15:
    prStack_10 = (registers *)(regs->r15 + operand_mem);
    break;
  case NUMBER:
    prStack_10 = (registers *)0x0;
    break;
  case ST0:
    prStack_10 = (registers *)0x0;
    break;
  case ST1:
    prStack_10 = (registers *)0x0;
    break;
  case ST2:
    prStack_10 = (registers *)0x0;
    break;
  case ST3:
    prStack_10 = (registers *)0x0;
    break;
  case ST4:
    prStack_10 = (registers *)0x0;
    break;
  case ST5:
    prStack_10 = (registers *)0x0;
    break;
  case ST6:
    prStack_10 = (registers *)0x0;
    break;
  case ST7:
    prStack_10 = (registers *)0x0;
    break;
  case LABELADDRESS:
    prStack_10 = (registers *)0x0;
    break;
  case XMM0:
    prStack_10 = (registers *)0x0;
    break;
  case XMM1:
    prStack_10 = (registers *)0x0;
    break;
  case XMM2:
    prStack_10 = (registers *)0x0;
    break;
  case XMM3:
    prStack_10 = (registers *)0x0;
    break;
  case XMM4:
    prStack_10 = (registers *)0x0;
    break;
  case XMM5:
    prStack_10 = (registers *)0x0;
    break;
  case XMM6:
    prStack_10 = (registers *)0x0;
    break;
  case XMM7:
    prStack_10 = (registers *)0x0;
    break;
  case XMM8:
    prStack_10 = (registers *)0x0;
    break;
  case XMM9:
    prStack_10 = (registers *)0x0;
    break;
  case XMM10:
    prStack_10 = (registers *)0x0;
    break;
  case XMM11:
    prStack_10 = (registers *)0x0;
    break;
  case XMM12:
    prStack_10 = (registers *)0x0;
    break;
  case XMM13:
    prStack_10 = (registers *)0x0;
    break;
  case XMM14:
    prStack_10 = (registers *)0x0;
    break;
  case XMM15:
    prStack_10 = (registers *)0x0;
    break;
  default:
    prStack_10 = (registers *)0x0;
  }
  return (uint8_t *)prStack_10;
}

Assistant:

uint8_t* get_address_8bit(asmcode::operand oper, uint64_t operand_mem, registers& regs)
    {
    switch (oper)
      {
      case asmcode::EMPTY: return nullptr;
      case asmcode::AL: return (uint8_t*)&regs.rax;
      case asmcode::AH: return (uint8_t*)(((uint8_t*)(&regs.rax)) + 1);
      case asmcode::BL: return (uint8_t*)&regs.rbx;
      case asmcode::BH: return (uint8_t*)(((uint8_t*)(&regs.rbx)) + 1);
      case asmcode::CL: return (uint8_t*)&regs.rcx;
      case asmcode::CH: return (uint8_t*)(((uint8_t*)(&regs.rcx)) + 1);
      case asmcode::DL: return (uint8_t*)&regs.rdx;
      case asmcode::DH: return (uint8_t*)(((uint8_t*)(&regs.rdx)) + 1);
      case asmcode::RAX: return nullptr;
      case asmcode::RBX: return nullptr;
      case asmcode::RCX: return nullptr;
      case asmcode::RDX: return nullptr;
      case asmcode::RDI: return nullptr;
      case asmcode::RSI: return nullptr;
      case asmcode::RSP: return nullptr;
      case asmcode::RBP: return nullptr;
      case asmcode::R8:  return nullptr;
      case asmcode::R9:  return nullptr;
      case asmcode::R10: return nullptr;
      case asmcode::R11: return nullptr;
      case asmcode::R12: return nullptr;
      case asmcode::R13: return nullptr;
      case asmcode::R14: return nullptr;
      case asmcode::R15: return nullptr;
      case asmcode::MEM_RAX: return nullptr;
      case asmcode::MEM_RBX: return nullptr;
      case asmcode::MEM_RCX: return nullptr;
      case asmcode::MEM_RDX: return nullptr;
      case asmcode::MEM_RDI: return nullptr;
      case asmcode::MEM_RSI: return nullptr;
      case asmcode::MEM_RSP: return nullptr;
      case asmcode::MEM_RBP: return nullptr;
      case asmcode::MEM_R8:  return nullptr;
      case asmcode::MEM_R9:  return nullptr;
      case asmcode::MEM_R10: return nullptr;
      case asmcode::MEM_R11: return nullptr;
      case asmcode::MEM_R12: return nullptr;
      case asmcode::MEM_R13: return nullptr;
      case asmcode::MEM_R14: return nullptr;
      case asmcode::MEM_R15: return nullptr;
      case asmcode::BYTE_MEM_RAX: return (uint8_t*)(regs.rax + operand_mem);
      case asmcode::BYTE_MEM_RBX: return (uint8_t*)(regs.rbx + operand_mem);
      case asmcode::BYTE_MEM_RCX: return (uint8_t*)(regs.rcx + operand_mem);
      case asmcode::BYTE_MEM_RDX: return (uint8_t*)(regs.rdx + operand_mem);
      case asmcode::BYTE_MEM_RDI: return (uint8_t*)(regs.rdi + operand_mem);
      case asmcode::BYTE_MEM_RSI: return (uint8_t*)(regs.rsi + operand_mem);
      case asmcode::BYTE_MEM_RSP: return (uint8_t*)(regs.rsp + operand_mem);
      case asmcode::BYTE_MEM_RBP: return (uint8_t*)(regs.rbp + operand_mem);
      case asmcode::BYTE_MEM_R8:  return (uint8_t*)(regs.r8 + operand_mem);
      case asmcode::BYTE_MEM_R9:  return (uint8_t*)(regs.r9 + operand_mem);
      case asmcode::BYTE_MEM_R10: return (uint8_t*)(regs.r10 + operand_mem);
      case asmcode::BYTE_MEM_R11: return (uint8_t*)(regs.r11 + operand_mem);
      case asmcode::BYTE_MEM_R12: return (uint8_t*)(regs.r12 + operand_mem);
      case asmcode::BYTE_MEM_R13: return (uint8_t*)(regs.r13 + operand_mem);
      case asmcode::BYTE_MEM_R14: return (uint8_t*)(regs.r14 + operand_mem);
      case asmcode::BYTE_MEM_R15: return (uint8_t*)(regs.r15 + operand_mem);
      case asmcode::NUMBER: return nullptr;
      case asmcode::ST0:  return nullptr;
      case asmcode::ST1:  return nullptr;
      case asmcode::ST2:  return nullptr;
      case asmcode::ST3:  return nullptr;
      case asmcode::ST4:  return nullptr;
      case asmcode::ST5:  return nullptr;
      case asmcode::ST6:  return nullptr;
      case asmcode::ST7:  return nullptr;
      case asmcode::XMM0: return nullptr;
      case asmcode::XMM1: return nullptr;
      case asmcode::XMM2: return nullptr;
      case asmcode::XMM3: return nullptr;
      case asmcode::XMM4: return nullptr;
      case asmcode::XMM5: return nullptr;
      case asmcode::XMM6: return nullptr;
      case asmcode::XMM7: return nullptr;
      case asmcode::XMM8: return nullptr;
      case asmcode::XMM9: return nullptr;
      case asmcode::XMM10:return nullptr;
      case asmcode::XMM11:return nullptr;
      case asmcode::XMM12:return nullptr;
      case asmcode::XMM13:return nullptr;
      case asmcode::XMM14:return nullptr;
      case asmcode::XMM15:return nullptr;
      case asmcode::LABELADDRESS: return nullptr;
      default: return nullptr;
      }
    }